

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neuron.cpp
# Opt level: O1

void __thiscall indk::Neuron::doFinalizeInput(Neuron *this,float P)

{
  long lVar1;
  
  if (this->OutputSignalSize <= this->OutputSignalPointer) {
    this->OutputSignalPointer = 0;
  }
  lVar1 = this->OutputSignalPointer;
  this->OutputSignal[lVar1] = P;
  this->OutputSignalPointer = lVar1 + 1;
  LOCK();
  (this->t).super___atomic_base<long>._M_i = (this->t).super___atomic_base<long>._M_i + 1;
  UNLOCK();
  return;
}

Assistant:

void indk::Neuron::doFinalizeInput(float P) {
    if (OutputSignalPointer >= OutputSignalSize) OutputSignalPointer = 0;
    OutputSignal[OutputSignalPointer] = P;
    OutputSignalPointer++;
    t.store(t.load()+1);
//    std::cout << "Object processed " << Name << std::endl;
}